

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateTableCreator
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IdlNamer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  BaseType BVar3;
  FieldDef *pFVar4;
  KotlinGenerator *pKVar5;
  IDLOptions *pIVar6;
  CodeWriter *writer_00;
  int iVar7;
  ostream *poVar8;
  pointer ppFVar9;
  long lVar10;
  char *pcVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  string name;
  stringstream params;
  string local_270;
  StructDef *local_250;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_248;
  KotlinGenerator *local_230;
  IDLOptions *local_228;
  CodeWriter *local_220;
  string local_218;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_248,&(struct_def->fields).vec);
  if (local_248.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_248.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar13 = true;
    iVar7 = 0;
  }
  else {
    bVar13 = true;
    iVar7 = 0;
    ppFVar9 = local_248.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pFVar4 = *ppFVar9;
      if (pFVar4->deprecated == false) {
        if ((pFVar4->value).type.base_type == BASE_TYPE_STRUCT) {
          bVar12 = ((pFVar4->value).type.struct_def)->fixed;
        }
        else {
          bVar12 = 0;
        }
        iVar7 = iVar7 + (uint)(bVar12 ^ 1);
        if (bVar12 != 0) {
          bVar13 = false;
        }
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 !=
             local_248.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (((bVar13) && (iVar7 != 0)) && (iVar7 < 0x7f)) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"create","");
    paVar1 = &local_270.field_2;
    local_270._M_dataplus._M_p = (pointer)paVar1;
    local_250 = struct_def;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
    this_00 = &this->namer_;
    IdlNamer::LegacyJavaMethod2(&local_1d8,this_00,(string *)local_1b8,local_250,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    local_228 = options;
    local_220 = writer;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar2 = (ostream *)(local_1b8 + 0x10);
    local_230 = this;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"builder: FlatBufferBuilder",0x1a);
    for (ppFVar9 = local_248.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar9 !=
        local_248.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar9 = ppFVar9 + 1) {
      pFVar4 = *ppFVar9;
      if (pFVar4->deprecated == false) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
        (*(this_00->super_Namer)._vptr_Namer[7])(&local_270,this_00,pFVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,local_270._M_dataplus._M_p,local_270._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        bVar13 = (pFVar4->value).type.base_type - BASE_TYPE_UTYPE < 0xc;
        pcVar11 = "Offset: ";
        if (bVar13) {
          pcVar11 = ": ";
        }
        lVar10 = 8;
        if (bVar13) {
          lVar10 = 2;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar11,lVar10);
        BVar3 = (pFVar4->value).type.base_type;
        bVar13 = BVar3 - BASE_TYPE_UTYPE < 0xc;
        bVar14 = pFVar4->presence == kOptional;
        pcVar11 = "";
        if (bVar14 && bVar13) {
          pcVar11 = "?";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,
                   *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::BaseType_const&)::kotlin_typename
                             + (ulong)BVar3 * 8),(allocator<char> *)&local_218);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,(ulong)(bVar14 && bVar13))
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::__cxx11::stringbuf::str();
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Int","");
    writer_00 = local_220;
    pIVar6 = local_228;
    pKVar5 = local_230;
    local_1e8 = (code *)0x0;
    pcStack_1e0 = (code *)0x0;
    local_1f8._M_unused._M_object = (void *)0x0;
    local_1f8._8_8_ = 0;
    local_1f8._M_unused._M_object = operator_new(0x20);
    *(CodeWriter **)local_1f8._M_unused._0_8_ = writer_00;
    *(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> **)
     ((long)local_1f8._M_unused._0_8_ + 8) = &local_248;
    *(StructDef **)((long)local_1f8._M_unused._0_8_ + 0x10) = local_250;
    *(KotlinGenerator **)((long)local_1f8._M_unused._0_8_ + 0x18) = pKVar5;
    pcStack_1e0 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:865:11)>
                  ::_M_invoke;
    local_1e8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin.cpp:865:11)>
                ::_M_manager;
    GenerateFun(writer_00,&local_1d8,&local_270,&local_218,(function<void_()> *)&local_1f8,
                pIVar6->gen_jvmstatic);
    if (local_1e8 != (code *)0x0) {
      (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_248.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenerateTableCreator(StructDef &struct_def, CodeWriter &writer,
                            const IDLOptions options) const {
    // Generate a method that creates a table in one go. This is only possible
    // when the table has no struct fields, since those have to be created
    // inline, and there's no way to do so in Java.
    bool has_no_struct_fields = true;
    int num_fields = 0;
    auto fields_vec = struct_def.fields.vec;

    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (IsStruct(field.value.type)) {
        has_no_struct_fields = false;
      } else {
        num_fields++;
      }
    }
    // JVM specifications restrict default constructor params to be < 255.
    // Longs and doubles take up 2 units, so we set the limit to be < 127.
    if (has_no_struct_fields && num_fields && num_fields < 127) {
      // Generate a table constructor of the form:
      // public static int createName(FlatBufferBuilder builder, args...)

      auto name = namer_.LegacyJavaMethod2("create", struct_def, "");
      std::stringstream params;
      params << "builder: FlatBufferBuilder";
      for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
        auto &field = **it;
        if (field.deprecated) continue;
        params << ", " << namer_.Variable(field);
        if (!IsScalar(field.value.type.base_type)) {
          params << "Offset: ";
        } else {
          params << ": ";
        }
        auto optional = field.IsScalarOptional() ? "?" : "";
        params << GenTypeBasic(field.value.type.base_type) << optional;
      }

      GenerateFun(
          writer, name, params.str(), "Int",
          [&]() {
            writer.SetValue("vec_size", NumToString(fields_vec.size()));

            writer += "builder.startTable({{vec_size}})";

            auto sortbysize = struct_def.sortbysize;
            auto largest = sortbysize ? sizeof(largest_scalar_t) : 1;
            for (size_t size = largest; size; size /= 2) {
              for (auto it = fields_vec.rbegin(); it != fields_vec.rend();
                   ++it) {
                auto &field = **it;
                auto base_type_size = SizeOf(field.value.type.base_type);
                if (!field.deprecated &&
                    (!sortbysize || size == base_type_size)) {
                  writer.SetValue("field_name", namer_.Field(field));

                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional()
                                ? "{{field_name}}?.run { \\"
                                : "\\";

                  writer += namer_.LegacyKotlinMethod("add", field, "") +
                            "(builder, {{field_name}}\\";
                  if (!IsScalar(field.value.type.base_type)) {
                    writer += "Offset\\";
                  }
                  // we wrap on null check for scalar optionals
                  writer += field.IsScalarOptional() ? ") }" : ")";
                }
              }
            }
            writer += "return end{{struct_name}}(builder)";
          },
          options.gen_jvmstatic);
    }
  }